

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ButtonBehavior
               (ImRect *bb,ImGuiID id,bool *out_hovered,bool *out_held,ImGuiButtonFlags flags)

{
  ImGuiWindow *pIVar1;
  bool bVar2;
  int iVar3;
  ImGuiWindow *window_00;
  byte *in_RCX;
  undefined1 *in_RDX;
  ImGuiID in_ESI;
  uint in_R8D;
  ImVec2 IVar4;
  bool is_repeating_already;
  bool is_double_click_release;
  bool held;
  bool nav_activated_by_inputs;
  bool nav_activated_by_code;
  bool hovered;
  bool pressed;
  bool flatten_hovered_children;
  ImGuiWindow *backup_hovered_window;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffff98;
  ImGuiHoveredFlags in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa4;
  byte bVar5;
  bool bVar6;
  undefined1 uVar7;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  ImRect *in_stack_ffffffffffffffa8;
  undefined1 repeat;
  byte bVar9;
  ImGuiMouseButton in_stack_ffffffffffffffb0;
  uint uVar8;
  bool local_4b;
  ImGuiContext *window_01;
  bool local_1;
  
  window_01 = GImGui;
  window_00 = GetCurrentWindow();
  if ((in_R8D & 0x100) == 0) {
    if ((in_R8D & 0x1e) == 0) {
      in_R8D = in_R8D | 2;
    }
    pIVar1 = window_01->HoveredWindow;
    bVar6 = false;
    if ((in_R8D & 0x20) != 0) {
      bVar6 = window_01->HoveredRootWindow == window_00->RootWindow;
    }
    if (bVar6 != false) {
      window_01->HoveredWindow = window_00;
    }
    local_1 = false;
    uVar7 = bVar6;
    local_4b = ItemHoverable(in_stack_ffffffffffffffa8,
                             CONCAT13(in_stack_ffffffffffffffa7,
                                      CONCAT12(in_stack_ffffffffffffffa6,
                                               CONCAT11(bVar6,in_stack_ffffffffffffffa4))));
    repeat = (undefined1)((ulong)in_stack_ffffffffffffffa8 >> 0x38);
    if ((((local_4b) && ((window_01->DragDropActive & 1U) != 0)) &&
        ((window_01->DragDropPayload).SourceId == in_ESI)) &&
       ((window_01->DragDropSourceFlags & 2U) == 0)) {
      local_4b = false;
    }
    if ((((window_01->DragDropActive & 1U) != 0) && ((in_R8D & 0x1000) != 0)) &&
       (((window_01->DragDropSourceFlags & 4U) == 0 &&
        (bVar2 = IsItemHovered(in_stack_ffffffffffffffa0), bVar2)))) {
      local_4b = true;
      SetHoveredID(in_ESI);
      iVar3 = CalcTypematicRepeatAmount
                        ((window_01->HoveredIdTimer + 0.0001) - (window_01->IO).DeltaTime,
                         window_01->HoveredIdTimer + 0.0001,0.7,0.0);
      local_1 = iVar3 != 0;
      if (local_1) {
        FocusWindow((ImGuiWindow *)
                    CONCAT17(in_stack_ffffffffffffffa7,
                             CONCAT16(in_stack_ffffffffffffffa6,
                                      CONCAT15(uVar7,CONCAT14(in_stack_ffffffffffffffa4,
                                                              in_stack_ffffffffffffffa0)))));
      }
    }
    if (bVar6 != false) {
      window_01->HoveredWindow = pIVar1;
    }
    if (((local_4b != false) && ((in_R8D & 0x40) != 0)) &&
       ((window_01->HoveredIdPreviousFrame != in_ESI && (window_01->HoveredIdPreviousFrame != 0))))
    {
      local_4b = false;
    }
    if (local_4b != false) {
      if (((in_R8D & 0x400) == 0) ||
         (((((window_01->IO).KeyCtrl & 1U) == 0 && (((window_01->IO).KeyShift & 1U) == 0)) &&
          (((window_01->IO).KeyAlt & 1U) == 0)))) {
        if (((in_R8D & 2) != 0) && (((window_01->IO).MouseClicked[0] & 1U) != 0)) {
          SetActiveID(in_ESI,window_00);
          if ((in_R8D & 0x2000) == 0) {
            SetFocusID(in_R8D,(ImGuiWindow *)window_01);
          }
          FocusWindow((ImGuiWindow *)
                      CONCAT17(in_stack_ffffffffffffffa7,
                               CONCAT16(in_stack_ffffffffffffffa6,
                                        CONCAT15(uVar7,CONCAT14(in_stack_ffffffffffffffa4,
                                                                in_stack_ffffffffffffffa0)))));
        }
        if ((((in_R8D & 4) != 0) && (((window_01->IO).MouseClicked[0] & 1U) != 0)) ||
           (((in_R8D & 0x10) != 0 && (((window_01->IO).MouseDoubleClicked[0] & 1U) != 0)))) {
          local_1 = true;
          if ((in_R8D & 0x800) == 0) {
            SetActiveID(in_ESI,window_00);
          }
          else {
            ClearActiveID();
          }
          FocusWindow((ImGuiWindow *)
                      CONCAT17(in_stack_ffffffffffffffa7,
                               CONCAT16(in_stack_ffffffffffffffa6,
                                        CONCAT15(uVar7,CONCAT14(in_stack_ffffffffffffffa4,
                                                                in_stack_ffffffffffffffa0)))));
        }
        if (((in_R8D & 8) != 0) && (((window_01->IO).MouseReleased[0] & 1U) != 0)) {
          if (((in_R8D & 1) == 0) ||
             ((window_01->IO).MouseDownDurationPrev[0] < (window_01->IO).KeyRepeatDelay)) {
            local_1 = true;
          }
          ClearActiveID();
        }
        if (((((in_R8D & 1) != 0) && (window_01->ActiveId == in_ESI)) &&
            (0.0 < (window_01->IO).MouseDownDuration[0])) &&
           (bVar6 = IsMouseClicked(in_stack_ffffffffffffffb0,(bool)repeat), bVar6)) {
          local_1 = true;
        }
      }
      if (local_1 != false) {
        window_01->NavDisableHighlight = true;
      }
    }
    if (((((window_01->NavId == in_ESI) && ((window_01->NavDisableHighlight & 1U) == 0)) &&
         ((window_01->NavDisableMouseHover & 1U) != 0)) &&
        (((window_01->ActiveId == 0 || (window_01->ActiveId == in_ESI)) ||
         (window_01->ActiveId == window_00->MoveId)))) && ((in_R8D & 0x4000) == 0)) {
      local_4b = true;
    }
    if (window_01->NavActivateDownId == in_ESI) {
      bVar2 = window_01->NavActivateId == in_ESI;
      bVar6 = IsNavInputTest(0,0x200a64);
      uVar8 = (uint)bVar6 << 0x18;
      if ((bVar2) || (bVar6)) {
        local_1 = true;
      }
      if (((bVar2) || (bVar6)) || (window_01->ActiveId == in_ESI)) {
        window_01->NavActivateId = in_ESI;
        SetActiveID(in_ESI,window_00);
        if (((bVar2) || ((uVar8 & 0x1000000) != 0)) && ((in_R8D & 0x2000) == 0)) {
          SetFocusID(in_R8D,(ImGuiWindow *)window_01);
        }
      }
    }
    bVar9 = 0;
    if (window_01->ActiveId == in_ESI) {
      if (local_1 != false) {
        window_01->ActiveIdHasBeenPressedBefore = true;
      }
      if (window_01->ActiveIdSource == ImGuiInputSource_Mouse) {
        bVar9 = 0;
        if ((window_01->ActiveIdIsJustActivated & 1U) != 0) {
          bVar9 = 0;
          IVar4 = ::operator-(in_stack_ffffffffffffff98,(ImVec2 *)0x200b4a);
          window_01->ActiveIdClickOffset = IVar4;
        }
        if (((window_01->IO).MouseDown[0] & 1U) == 0) {
          if (((local_4b != false) && ((in_R8D & 2) != 0)) &&
             ((window_01->DragDropActive & 1U) == 0)) {
            bVar5 = 0;
            if ((in_R8D & 0x10) != 0) {
              bVar5 = (window_01->IO).MouseDownWasDoubleClick[0];
            }
            bVar6 = false;
            if ((in_R8D & 1) != 0) {
              bVar6 = (window_01->IO).KeyRepeatDelay <= (window_01->IO).MouseDownDurationPrev[0];
            }
            if (((bVar5 & 1) == 0) && (!bVar6)) {
              local_1 = true;
            }
          }
          ClearActiveID();
        }
        else {
          bVar9 = 1;
        }
        if ((in_R8D & 0x2000) == 0) {
          window_01->NavDisableHighlight = true;
        }
      }
      else {
        bVar9 = 0;
        if ((window_01->ActiveIdSource == ImGuiInputSource_Nav) &&
           (bVar9 = 0, window_01->NavActivateDownId != in_ESI)) {
          bVar9 = 0;
          ClearActiveID();
        }
      }
    }
    if (in_RDX != (undefined1 *)0x0) {
      *in_RDX = local_4b;
    }
    if (in_RCX != (byte *)0x0) {
      *in_RCX = bVar9 & 1;
    }
  }
  else {
    if (in_RDX != (undefined1 *)0x0) {
      *in_RDX = 0;
    }
    if (in_RCX != (byte *)0x0) {
      *in_RCX = 0;
    }
    if (window_01->ActiveId == in_ESI) {
      ClearActiveID();
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::ButtonBehavior(const ImRect& bb, ImGuiID id, bool* out_hovered, bool* out_held, ImGuiButtonFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    if (flags & ImGuiButtonFlags_Disabled)
    {
        if (out_hovered) *out_hovered = false;
        if (out_held) *out_held = false;
        if (g.ActiveId == id) ClearActiveID();
        return false;
    }

    // Default behavior requires click+release on same spot
    if ((flags & (ImGuiButtonFlags_PressedOnClickRelease | ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_PressedOnRelease | ImGuiButtonFlags_PressedOnDoubleClick)) == 0)
        flags |= ImGuiButtonFlags_PressedOnClickRelease;

    ImGuiWindow* backup_hovered_window = g.HoveredWindow;
    const bool flatten_hovered_children = (flags & ImGuiButtonFlags_FlattenChildren) && g.HoveredRootWindow == window->RootWindow;
    if (flatten_hovered_children)
        g.HoveredWindow = window;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0 && window->DC.LastItemId != id)
        ImGuiTestEngineHook_ItemAdd(&g, bb, id);
#endif

    bool pressed = false;
    bool hovered = ItemHoverable(bb, id);

    // Drag source doesn't report as hovered
    if (hovered && g.DragDropActive && g.DragDropPayload.SourceId == id && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoDisableHover))
        hovered = false;

    // Special mode for Drag and Drop where holding button pressed for a long time while dragging another item triggers the button
    if (g.DragDropActive && (flags & ImGuiButtonFlags_PressedOnDragDropHold) && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoHoldToOpenOthers))
        if (IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        {
            hovered = true;
            SetHoveredID(id);
            if (CalcTypematicRepeatAmount(g.HoveredIdTimer + 0.0001f - g.IO.DeltaTime, g.HoveredIdTimer + 0.0001f, 0.70f, 0.00f))
            {
                pressed = true;
                FocusWindow(window);
            }
        }

    if (flatten_hovered_children)
        g.HoveredWindow = backup_hovered_window;

    // AllowOverlap mode (rarely used) requires previous frame HoveredId to be null or to match. This allows using patterns where a later submitted widget overlaps a previous one.
    if (hovered && (flags & ImGuiButtonFlags_AllowItemOverlap) && (g.HoveredIdPreviousFrame != id && g.HoveredIdPreviousFrame != 0))
        hovered = false;

    // Mouse
    if (hovered)
    {
        if (!(flags & ImGuiButtonFlags_NoKeyModifiers) || (!g.IO.KeyCtrl && !g.IO.KeyShift && !g.IO.KeyAlt))
        {
            if ((flags & ImGuiButtonFlags_PressedOnClickRelease) && g.IO.MouseClicked[0])
            {
                SetActiveID(id, window);
                if (!(flags & ImGuiButtonFlags_NoNavFocus))
                    SetFocusID(id, window);
                FocusWindow(window);
            }
            if (((flags & ImGuiButtonFlags_PressedOnClick) && g.IO.MouseClicked[0]) || ((flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseDoubleClicked[0]))
            {
                pressed = true;
                if (flags & ImGuiButtonFlags_NoHoldingActiveID)
                    ClearActiveID();
                else
                    SetActiveID(id, window); // Hold on ID
                FocusWindow(window);
            }
            if ((flags & ImGuiButtonFlags_PressedOnRelease) && g.IO.MouseReleased[0])
            {
                if (!((flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[0] >= g.IO.KeyRepeatDelay))  // Repeat mode trumps <on release>
                    pressed = true;
                ClearActiveID();
            }

            // 'Repeat' mode acts when held regardless of _PressedOn flags (see table above).
            // Relies on repeat logic of IsMouseClicked() but we may as well do it ourselves if we end up exposing finer RepeatDelay/RepeatRate settings.
            if ((flags & ImGuiButtonFlags_Repeat) && g.ActiveId == id && g.IO.MouseDownDuration[0] > 0.0f && IsMouseClicked(0, true))
                pressed = true;
        }

        if (pressed)
            g.NavDisableHighlight = true;
    }

    // Gamepad/Keyboard navigation
    // We report navigated item as hovered but we don't set g.HoveredId to not interfere with mouse.
    if (g.NavId == id && !g.NavDisableHighlight && g.NavDisableMouseHover && (g.ActiveId == 0 || g.ActiveId == id || g.ActiveId == window->MoveId))
        if (!(flags & ImGuiButtonFlags_NoHoveredOnNav))
            hovered = true;

    if (g.NavActivateDownId == id)
    {
        bool nav_activated_by_code = (g.NavActivateId == id);
        bool nav_activated_by_inputs = IsNavInputTest(ImGuiNavInput_Activate, (flags & ImGuiButtonFlags_Repeat) ? ImGuiInputReadMode_Repeat : ImGuiInputReadMode_Pressed);
        if (nav_activated_by_code || nav_activated_by_inputs)
            pressed = true;
        if (nav_activated_by_code || nav_activated_by_inputs || g.ActiveId == id)
        {
            // Set active id so it can be queried by user via IsItemActive(), equivalent of holding the mouse button.
            g.NavActivateId = id; // This is so SetActiveId assign a Nav source
            SetActiveID(id, window);
            if ((nav_activated_by_code || nav_activated_by_inputs) && !(flags & ImGuiButtonFlags_NoNavFocus))
                SetFocusID(id, window);
        }
    }

    bool held = false;
    if (g.ActiveId == id)
    {
        if (pressed)
            g.ActiveIdHasBeenPressedBefore = true;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (g.ActiveIdIsJustActivated)
                g.ActiveIdClickOffset = g.IO.MousePos - bb.Min;
            if (g.IO.MouseDown[0])
            {
                held = true;
            }
            else
            {
                if (hovered && (flags & ImGuiButtonFlags_PressedOnClickRelease) && !g.DragDropActive)
                {
                    bool is_double_click_release = (flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseDownWasDoubleClick[0];
                    bool is_repeating_already = (flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[0] >= g.IO.KeyRepeatDelay; // Repeat mode trumps <on release>
                    if (!is_double_click_release && !is_repeating_already)
                        pressed = true;
                }
                ClearActiveID();
            }
            if (!(flags & ImGuiButtonFlags_NoNavFocus))
                g.NavDisableHighlight = true;
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.NavActivateDownId != id)
                ClearActiveID();
        }
    }

    if (out_hovered) *out_hovered = hovered;
    if (out_held) *out_held = held;

    return pressed;
}